

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O2

unique_ptr<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>_> __thiscall
MetaSim::RandomVar::parsevar(RandomVar *this,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *className;
  ParseExc *this_00;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parms;
  string p;
  string token;
  
  std::__cxx11::string::string((string *)&p,"(",(allocator *)&local_a0);
  parse_util::get_token(&token,str,&p);
  std::__cxx11::string::~string((string *)&p);
  std::__cxx11::string::string((string *)&local_a0,"(",&local_a2);
  std::__cxx11::string::string((string *)&parms,")",&local_a1);
  parse_util::get_param(&p,str,&local_a0,(string *)&parms);
  std::__cxx11::string::~string((string *)&parms);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,",",&local_a2);
  parse_util::split_param(&parms,&p,&local_a0,'(',')');
  std::__cxx11::string::~string((string *)&local_a0);
  className = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::instance();
  genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::create((genericFactory<MetaSim::RandomVar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this,className,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&token);
  if (this->_vptr_RandomVar != (_func_int **)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parms);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)&token);
    return (__uniq_ptr_data<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>,_true,_true>
           )(__uniq_ptr_data<MetaSim::RandomVar,_std::default_delete<MetaSim::RandomVar>,_true,_true>
             )this;
  }
  this_00 = (ParseExc *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_a0,"parsevar",&local_a2);
  parse_util::ParseExc::ParseExc(this_00,&local_a0,str);
  __cxa_throw(this_00,&parse_util::ParseExc::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<RandomVar> RandomVar::parsevar(const std::string &str)
    {
        string token = get_token(str);
        DBGPRINT_2("token = ",  token);
                
        string p = get_param(str);
        DBGPRINT_2("parms = ", p);

        vector<string> parms = split_param(p);
  
        for (size_t i = 0; i < parms.size(); ++i) 
            DBGPRINT_4("par[", i, "] = ", parms[i]);
                
        unique_ptr<RandomVar> var(FACT(RandomVar).create(token,parms));
                
        if (var.get() == nullptr) throw ParseExc("parsevar", str);
                                
        return var;
    }